

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticFundamentalParameterData.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticFundamentalParameterData::operator==
          (UnderwaterAcousticFundamentalParameterData *this,
          UnderwaterAcousticFundamentalParameterData *Value)

{
  UnderwaterAcousticFundamentalParameterData *Value_local;
  UnderwaterAcousticFundamentalParameterData *this_local;
  
  if (this->m_ui16AEPI == Value->m_ui16AEPI) {
    if (this->m_ui16ScanPattern == Value->m_ui16ScanPattern) {
      if (((float)this->m_f32BeamCenterAzimuth != (float)Value->m_f32BeamCenterAzimuth) ||
         (NAN((float)this->m_f32BeamCenterAzimuth) || NAN((float)Value->m_f32BeamCenterAzimuth))) {
        this_local._7_1_ = false;
      }
      else if (((float)this->m_f32AzimuthalBeamWidth != (float)Value->m_f32AzimuthalBeamWidth) ||
              (NAN((float)this->m_f32AzimuthalBeamWidth) ||
               NAN((float)Value->m_f32AzimuthalBeamWidth))) {
        this_local._7_1_ = false;
      }
      else if (((float)this->m_f32BeamCenterDE != (float)Value->m_f32BeamCenterDE) ||
              (NAN((float)this->m_f32BeamCenterDE) || NAN((float)Value->m_f32BeamCenterDE))) {
        this_local._7_1_ = false;
      }
      else if (((float)this->m_f32DEBeamwidth != (float)Value->m_f32DEBeamwidth) ||
              (NAN((float)this->m_f32DEBeamwidth) || NAN((float)Value->m_f32DEBeamwidth))) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL UnderwaterAcousticFundamentalParameterData::operator == ( const UnderwaterAcousticFundamentalParameterData & Value ) const
{
    if( m_ui16AEPI                != Value.m_ui16AEPI )              return false;
    if( m_ui16ScanPattern         != Value.m_ui16ScanPattern )       return false;
    if( m_f32BeamCenterAzimuth    != Value.m_f32BeamCenterAzimuth )  return false;
    if( m_f32AzimuthalBeamWidth   != Value.m_f32AzimuthalBeamWidth ) return false;
    if( m_f32BeamCenterDE         != Value.m_f32BeamCenterDE )       return false;
    if( m_f32DEBeamwidth          != Value.m_f32DEBeamwidth )        return false;
    return true;
}